

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# einsum.cpp
# Opt level: O3

int __thiscall
ncnn::Einsum::forward
          (Einsum *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  int *piVar2;
  char cVar3;
  pointer pMVar4;
  pointer pbVar5;
  pointer pcVar6;
  Mat *pMVar7;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  float *pfVar13;
  ulong uVar14;
  Einsum *pEVar15;
  long lVar16;
  int s;
  long lVar17;
  int iVar18;
  size_t _elemsize;
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  float fVar24;
  vector<int,_std::allocator<int>_> indexes;
  allocator_type local_99;
  vector<int,_std::allocator<int>_> local_98;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_80;
  Option *local_78;
  size_t local_70;
  Einsum *local_68;
  vector<int,_std::allocator<int>_> local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_40;
  ulong local_38;
  
  _elemsize = ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start)->elemsize;
  if (((this->lhs_tokens).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (this->lhs_tokens).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (iVar10 = std::__cxx11::string::compare((char *)&this->rhs_token), iVar10 == 0)) {
    pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar7,1,_elemsize,opt->blob_allocator);
    if ((float *)pMVar7->data == (float *)0x0) {
      return -100;
    }
    if ((long)pMVar7->c * pMVar7->cstep == 0) {
      return -100;
    }
    pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = (long)pMVar4->h;
    if (lVar12 < 1) {
      fVar24 = 0.0;
    }
    else {
      pfVar13 = (float *)pMVar4->data;
      fVar24 = 0.0;
      do {
        fVar24 = fVar24 + *pfVar13;
        pfVar13 = (float *)((long)pfVar13 + (long)pMVar4->w * pMVar4->elemsize + 4);
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
    }
    *(float *)pMVar7->data = fVar24;
    return 0;
  }
  pvVar1 = &this->lhs_tokens;
  local_68 = this;
  local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(0x40);
  local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start + 0x10;
  lVar12 = 0;
  do {
    piVar2 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + lVar12;
    piVar2[0] = 1;
    piVar2[1] = 1;
    piVar2[2] = 1;
    piVar2[3] = 1;
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0x10);
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar14 = 0;
  lVar12 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar4;
  if (lVar12 != 0) {
    lVar12 = (lVar12 >> 3) * -0x71c71c71c71c71c7;
    pbVar5 = (pvVar1->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar16 = 0;
    do {
      iVar10 = pMVar4[lVar16].dims;
      if (0 < (long)iVar10) {
        pcVar6 = pbVar5[lVar16]._M_dataplus._M_p;
        lVar17 = 0;
        do {
          iVar18 = pMVar4[lVar16].w;
          iVar20 = pMVar4[lVar16].h;
          iVar21 = 1;
          if (iVar10 == 1) {
            iVar21 = iVar18;
          }
          iVar19 = iVar21;
          if (lVar17 == 0) {
            iVar19 = iVar20;
          }
          if (iVar10 != 2) {
            iVar19 = iVar21;
          }
          iVar21 = iVar19;
          if (lVar17 == 1) {
            iVar21 = iVar18;
          }
          if (iVar10 != 2) {
            iVar21 = iVar19;
          }
          iVar19 = iVar21;
          if (lVar17 == 0) {
            iVar19 = pMVar4[lVar16].c;
          }
          if (iVar10 != 3) {
            iVar19 = iVar21;
          }
          iVar21 = iVar19;
          if (lVar17 == 1) {
            iVar21 = iVar20;
          }
          if (iVar10 != 3) {
            iVar21 = iVar19;
          }
          iVar19 = iVar21;
          if (lVar17 == 2) {
            iVar19 = iVar18;
          }
          if (iVar10 != 3) {
            iVar19 = iVar21;
          }
          iVar21 = pMVar4[lVar16].c;
          if (lVar17 != 0) {
            iVar21 = iVar19;
          }
          if (iVar10 != 4) {
            iVar21 = iVar19;
          }
          iVar19 = iVar21;
          if (lVar17 == 1) {
            iVar19 = pMVar4[lVar16].d;
          }
          if (iVar10 == 4) {
            iVar21 = iVar19;
          }
          if (lVar17 != 2) {
            iVar20 = iVar21;
          }
          if (iVar10 != 4) {
            iVar20 = iVar21;
          }
          if (lVar17 != 3) {
            iVar18 = iVar20;
          }
          if (iVar10 != 4) {
            iVar18 = iVar20;
          }
          cVar3 = pcVar6[lVar17];
          uVar22 = (int)cVar3 - 0x68;
          uVar9 = (ulong)uVar22;
          if ((int)uVar22 < (int)uVar14) {
            uVar9 = uVar14;
          }
          uVar14 = uVar9;
          local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[(long)cVar3 + -0x69] = iVar18;
          lVar17 = lVar17 + 1;
        } while (iVar10 != lVar17);
      }
      lVar16 = lVar16 + 1;
      local_80 = top_blobs;
      local_78 = opt;
      local_70 = _elemsize;
    } while (lVar16 != lVar12 + (ulong)(lVar12 == 0));
  }
  local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_48 = pvVar1;
  local_40 = bottom_blobs;
  std::vector<int,_std::allocator<int>_>::resize(&local_60,uVar14);
  uVar22 = (uint)(local_68->rhs_token)._M_string_length;
  std::vector<int,_std::allocator<int>_>::vector(&local_98,uVar14,&local_99);
  uVar14 = (ulong)uVar22;
  switch(uVar22) {
  case 1:
    pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar7,*local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,_elemsize,opt->blob_allocator);
    pvVar8 = local_40;
    iVar10 = -100;
    if (((pMVar7->data == (void *)0x0) || ((long)pMVar7->c * pMVar7->cstep == 0)) ||
       (iVar10 = 0, pMVar7->w < 1)) goto LAB_0055c183;
    lVar12 = 0;
    do {
      *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start = (int)lVar12;
      fVar24 = sum_dim(&local_60,1,pvVar8,pvVar1,&local_98);
      *(float *)((long)pMVar7->data + lVar12 * 4) = fVar24;
      lVar12 = lVar12 + 1;
    } while (lVar12 < pMVar7->w);
    break;
  case 2:
    pEVar15 = (Einsum *)
              (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create((Mat *)pEVar15,
                local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[1],
                *local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,_elemsize,opt->blob_allocator);
    pvVar8 = local_40;
    pvVar1 = local_48;
    iVar10 = -100;
    if (((pEVar15->super_Layer)._vptr_Layer == (_func_int **)0x0) ||
       ((long)(int)(pEVar15->super_Layer).type._M_string_length *
        (pEVar15->super_Layer).type.field_2._M_allocated_capacity == 0)) goto LAB_0055c183;
    if (0 < *(int *)&(pEVar15->super_Layer).type._M_dataplus._M_p) {
      lVar12 = 0;
      local_80 = top_blobs;
      local_78 = opt;
      local_70 = _elemsize;
      local_68 = pEVar15;
      local_38 = (ulong)uVar22;
      do {
        *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = (int)lVar12;
        if (0 < *(int *)&(pEVar15->super_Layer).field_0x2c) {
          lVar16 = 0;
          do {
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[1] = (int)lVar16;
            fVar24 = sum_dim(&local_60,2,pvVar8,pvVar1,&local_98);
            lVar17 = (long)*(int *)&(local_68->super_Layer).field_0x2c;
            *(float *)((long)(local_68->super_Layer)._vptr_Layer +
                      lVar16 * 4 +
                      *(size_t *)&(local_68->super_Layer).support_tensor_storage * lVar12 * lVar17)
                 = fVar24;
            lVar16 = lVar16 + 1;
            pEVar15 = local_68;
          } while (lVar16 < lVar17);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < *(int *)&(pEVar15->super_Layer).type._M_dataplus._M_p);
      _elemsize = local_70;
      top_blobs = local_80;
      opt = local_78;
      if ((int)local_38 == 4) goto switchD_0055bd87_caseD_4;
      uVar14 = local_38;
      if ((int)local_38 == 3) goto switchD_0055bd87_caseD_3;
    }
    break;
  case 3:
switchD_0055bd87_caseD_3:
    pEVar15 = (Einsum *)
              (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create((Mat *)pEVar15,
                local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[2],
                local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[1],
                *local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,_elemsize,opt->blob_allocator);
    pvVar1 = local_48;
    iVar10 = -100;
    if (((pEVar15->super_Layer)._vptr_Layer == (_func_int **)0x0) ||
       (iVar18 = (int)(pEVar15->super_Layer).type._M_string_length,
       (pEVar15->super_Layer).type.field_2._M_allocated_capacity * (long)iVar18 == 0))
    goto LAB_0055c183;
    if (0 < iVar18) {
      lVar12 = 0;
      local_80 = top_blobs;
      local_78 = opt;
      local_70 = _elemsize;
      local_68 = pEVar15;
      local_38 = uVar14;
      do {
        *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = (int)lVar12;
        if (0 < *(int *)&(pEVar15->super_Layer).type._M_dataplus._M_p) {
          lVar16 = 0;
          do {
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[1] = (int)lVar16;
            if (0 < *(int *)&(pEVar15->super_Layer).field_0x2c) {
              lVar17 = 0;
              do {
                local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[2] = (int)lVar17;
                fVar24 = sum_dim(&local_60,3,local_40,pvVar1,&local_98);
                lVar11 = (long)*(int *)&(local_68->super_Layer).field_0x2c;
                *(float *)((long)(local_68->super_Layer)._vptr_Layer +
                          lVar17 * 4 +
                          (lVar16 * lVar11 +
                          (local_68->super_Layer).type.field_2._M_allocated_capacity * lVar12) *
                          *(size_t *)&(local_68->super_Layer).support_tensor_storage) = fVar24;
                lVar17 = lVar17 + 1;
                pEVar15 = local_68;
              } while (lVar17 < lVar11);
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 < *(int *)&(pEVar15->super_Layer).type._M_dataplus._M_p);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < (int)(pEVar15->super_Layer).type._M_string_length);
      _elemsize = local_70;
      top_blobs = local_80;
      opt = local_78;
      if ((int)local_38 == 4) goto switchD_0055bd87_caseD_4;
    }
    break;
  case 4:
switchD_0055bd87_caseD_4:
    pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar7,local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[3],
                local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[2],
                local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[1],
                *local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,_elemsize,opt->blob_allocator);
    iVar10 = -100;
    if (((pMVar7->data == (void *)0x0) || (pMVar7->cstep * (long)pMVar7->c == 0)) ||
       (iVar10 = 0, pMVar7->c < 1)) goto LAB_0055c183;
    lVar12 = 0;
    do {
      *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start = (int)lVar12;
      if (0 < pMVar7->d) {
        lVar16 = 0;
        do {
          local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[1] = (int)lVar16;
          if (0 < pMVar7->h) {
            lVar17 = 0;
            do {
              local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[2] = (int)lVar17;
              if (pMVar7->w < 1) {
                lVar11 = (long)pMVar7->h;
              }
              else {
                lVar23 = 0;
                do {
                  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[3] = (int)lVar23;
                  fVar24 = sum_dim(&local_60,4,local_40,local_48,&local_98);
                  iVar10 = pMVar7->w;
                  lVar11 = (long)pMVar7->h;
                  *(float *)((long)pMVar7->data +
                            lVar23 * 4 +
                            ((lVar16 * lVar11 + lVar17) * (long)iVar10 + pMVar7->cstep * lVar12) *
                            pMVar7->elemsize) = fVar24;
                  lVar23 = lVar23 + 1;
                } while (lVar23 < iVar10);
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < lVar11);
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < pMVar7->d);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pMVar7->c);
  }
  iVar10 = 0;
LAB_0055c183:
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar10;
}

Assistant:

int Einsum::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // assert bottom_blobs.size() == lhs_tokens.size()
    // assert top_blobs.size() == 1

    size_t elemsize = bottom_blobs[0].elemsize;

    if (lhs_tokens.empty() && rhs_token == "ii")
    {
        // assert bottom_blobs.size() == 1
        // assert bottom_blob.dims == 2
        // assert bottom_blob.w == bottom_blob.h

        // trace
        Mat& top_blob = top_blobs[0];
        top_blob.create(1, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const Mat& bottom_blob = bottom_blobs[0];

        float sum = 0.f;

        for (int i = 0; i < bottom_blob.h; i++)
        {
            sum += bottom_blob.row(i)[i];
        }

        top_blob[0] = sum;

        return 0;
    }

    // resolve dimension sizes
    std::vector<int> dim_sizes(16, 1); // map ijklmnopqrstuvwx -> dim_size
    int dim_sizes_count = 0;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        const std::string& lhs_token = lhs_tokens[b];
        const Mat& bottom_blob = bottom_blobs[b];
        const int in_dims = bottom_blob.dims;

        for (int s = 0; s < in_dims; s++)
        {
            int dim_size = 1;
            if (in_dims == 1) dim_size = bottom_blob.w;
            if (in_dims == 2 && s == 0) dim_size = bottom_blob.h;
            if (in_dims == 2 && s == 1) dim_size = bottom_blob.w;
            if (in_dims == 3 && s == 0) dim_size = bottom_blob.c;
            if (in_dims == 3 && s == 1) dim_size = bottom_blob.h;
            if (in_dims == 3 && s == 2) dim_size = bottom_blob.w;
            if (in_dims == 4 && s == 0) dim_size = bottom_blob.c;
            if (in_dims == 4 && s == 1) dim_size = bottom_blob.d;
            if (in_dims == 4 && s == 2) dim_size = bottom_blob.h;
            if (in_dims == 4 && s == 3) dim_size = bottom_blob.w;

            int dim_sizes_index = lhs_token[s] - 'i';
            dim_sizes[dim_sizes_index] = dim_size;
            dim_sizes_count = std::max(dim_sizes_count, dim_sizes_index + 1);
        }
    }

    dim_sizes.resize(dim_sizes_count);

    const int out_dims = (int)rhs_token.size();

    std::vector<int> indexes(dim_sizes_count);

    if (out_dims == 1)
    {
        Mat& top_blob = top_blobs[0];
        top_blob.create(dim_sizes[0], elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int i = 0; i < top_blob.w; i++)
        {
            indexes[0] = i;

            float sum = sum_dim(dim_sizes, 1, bottom_blobs, lhs_tokens, indexes);

            top_blob[i] = sum;
        }
    }

    if (out_dims == 2)
    {
        Mat& top_blob = top_blobs[0];
        top_blob.create(dim_sizes[1], dim_sizes[0], elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int i = 0; i < top_blob.h; i++)
        {
            indexes[0] = i;

            for (int j = 0; j < top_blob.w; j++)
            {
                indexes[1] = j;

                float sum = sum_dim(dim_sizes, 2, bottom_blobs, lhs_tokens, indexes);

                top_blob.row(i)[j] = sum;
            }
        }
    }

    if (out_dims == 3)
    {
        Mat& top_blob = top_blobs[0];
        top_blob.create(dim_sizes[2], dim_sizes[1], dim_sizes[0], elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int i = 0; i < top_blob.c; i++)
        {
            indexes[0] = i;

            for (int j = 0; j < top_blob.h; j++)
            {
                indexes[1] = j;

                for (int k = 0; k < top_blob.w; k++)
                {
                    indexes[2] = k;

                    float sum = sum_dim(dim_sizes, 3, bottom_blobs, lhs_tokens, indexes);

                    top_blob.channel(i).row(j)[k] = sum;
                }
            }
        }
    }

    if (out_dims == 4)
    {
        Mat& top_blob = top_blobs[0];
        top_blob.create(dim_sizes[3], dim_sizes[2], dim_sizes[1], dim_sizes[0], elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int i = 0; i < top_blob.c; i++)
        {
            indexes[0] = i;

            for (int j = 0; j < top_blob.d; j++)
            {
                indexes[1] = j;

                for (int k = 0; k < top_blob.h; k++)
                {
                    indexes[2] = k;

                    for (int l = 0; l < top_blob.w; l++)
                    {
                        indexes[3] = l;

                        float sum = sum_dim(dim_sizes, 4, bottom_blobs, lhs_tokens, indexes);

                        top_blob.channel(i).depth(j).row(k)[l] = sum;
                    }
                }
            }
        }
    }

    return 0;
}